

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3VdbeSorterInit(sqlite3 *db,int nField,VdbeCursor *pCsr)

{
  KeyInfo *__dest;
  u32 uVar1;
  u32 uVar2;
  Db *pDVar3;
  undefined1 auVar4 [16];
  VdbeSorter *__s;
  ulong uVar5;
  u8 *puVar6;
  long lVar7;
  u32 uVar8;
  VdbeSorter **ppVVar9;
  u64 n;
  byte bVar10;
  int iVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  iVar11 = 0;
  if ((db->temp_store != '\x02') && (iVar11 = 0, sqlite3Config.bCoreMutex != 0)) {
    iVar11 = db->aLimit[0xb];
  }
  uVar5 = (ulong)pCsr->pKeyInfo->nField;
  lVar7 = (long)(iVar11 * 0x60 + 0xc0);
  n = uVar5 * 8 + 0x20 + lVar7;
  __s = (VdbeSorter *)sqlite3DbMallocRaw(db,n);
  if (__s == (VdbeSorter *)0x0) {
    pCsr->pSorter = (VdbeSorter *)0x0;
    iVar11 = 7;
  }
  else {
    memset(__s,0,n);
    pCsr->pSorter = __s;
    __dest = (KeyInfo *)((long)&((VdbeSorter *)(__s->aTask + -1))->mnPmaSize + lVar7);
    __s->pKeyInfo = __dest;
    memcpy(__dest,pCsr->pKeyInfo,uVar5 * 8 + 0x20);
    *(undefined8 *)((long)__s->aTask + lVar7 + -0x50) = 0;
    if (iVar11 == 0 && nField != 0) {
      __dest->nField = (u16)nField;
    }
    pDVar3 = db->aDb;
    uVar1 = pDVar3->pBt->pBt->pageSize;
    __s->bUseThreads = 1 < (byte)((char)iVar11 + 1U);
    __s->pgsz = uVar1;
    bVar10 = (char)iVar11 + 1;
    __s->nTask = bVar10;
    __s->db = db;
    auVar4 = _DAT_00191d20;
    if (bVar10 != 0) {
      lVar7 = (ulong)bVar10 - 1;
      uVar5 = (ulong)(bVar10 + 1 & 0xfffffffe);
      auVar12._8_4_ = (int)lVar7;
      auVar12._0_8_ = lVar7;
      auVar12._12_4_ = (int)((ulong)lVar7 >> 0x20);
      ppVVar9 = &__s->aTask[0].pSorter;
      auVar12 = auVar12 ^ _DAT_00191d20;
      auVar13 = _DAT_00191d10;
      do {
        auVar14 = auVar13 ^ auVar4;
        if ((bool)(~(auVar14._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar14._0_4_ ||
                    auVar12._4_4_ < auVar14._4_4_) & 1)) {
          *ppVVar9 = __s;
        }
        if ((auVar14._12_4_ != auVar12._12_4_ || auVar14._8_4_ <= auVar12._8_4_) &&
            auVar14._12_4_ <= auVar12._12_4_) {
          ppVVar9[0xc] = __s;
        }
        lVar7 = auVar13._8_8_;
        auVar13._0_8_ = auVar13._0_8_ + 2;
        auVar13._8_8_ = lVar7 + 2;
        ppVVar9 = ppVVar9 + 0x18;
        uVar5 = uVar5 - 2;
      } while (uVar5 != 0);
    }
    uVar8 = sqlite3Config.szPma;
    iVar11 = 0;
    if (db->temp_store != '\x02') {
      __s->mnPmaSize = sqlite3Config.szPma * uVar1;
      uVar2 = pDVar3->pSchema->cache_size;
      if ((int)uVar8 < (int)uVar2) {
        uVar8 = uVar2;
      }
      lVar7 = (long)(int)uVar8 * (long)(int)uVar1;
      if (0x1fffffff < lVar7) {
        lVar7 = 0x20000000;
      }
      __s->mxPmaSize = (int)lVar7;
      iVar11 = 0;
      if (sqlite3Config.pScratch == (void *)0x0) {
        __s->nMemory = uVar1;
        puVar6 = (u8 *)sqlite3Malloc((long)(int)uVar1);
        (__s->list).aMemory = puVar6;
        iVar11 = 7;
        if (puVar6 != (u8 *)0x0) {
          iVar11 = 0;
        }
      }
    }
  }
  return iVar11;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeSorterInit(
  sqlite3 *db,                    /* Database connection (for malloc()) */
  int nField,                     /* Number of key fields in each record */
  VdbeCursor *pCsr                /* Cursor that holds the new sorter */
){
  int pgsz;                       /* Page size of main database */
  int i;                          /* Used to iterate through aTask[] */
  int mxCache;                    /* Cache size */
  VdbeSorter *pSorter;            /* The new sorter */
  KeyInfo *pKeyInfo;              /* Copy of pCsr->pKeyInfo with db==0 */
  int szKeyInfo;                  /* Size of pCsr->pKeyInfo in bytes */
  int sz;                         /* Size of pSorter in bytes */
  int rc = SQLITE_OK;
#if SQLITE_MAX_WORKER_THREADS==0
# define nWorker 0
#else
  int nWorker;
#endif

  /* Initialize the upper limit on the number of worker threads */
#if SQLITE_MAX_WORKER_THREADS>0
  if( sqlite3TempInMemory(db) || sqlite3GlobalConfig.bCoreMutex==0 ){
    nWorker = 0;
  }else{
    nWorker = db->aLimit[SQLITE_LIMIT_WORKER_THREADS];
  }
#endif

  /* Do not allow the total number of threads (main thread + all workers)
  ** to exceed the maximum merge count */
#if SQLITE_MAX_WORKER_THREADS>=SORTER_MAX_MERGE_COUNT
  if( nWorker>=SORTER_MAX_MERGE_COUNT ){
    nWorker = SORTER_MAX_MERGE_COUNT-1;
  }
#endif

  assert( pCsr->pKeyInfo && pCsr->pBt==0 );
  szKeyInfo = sizeof(KeyInfo) + (pCsr->pKeyInfo->nField-1)*sizeof(CollSeq*);
  sz = sizeof(VdbeSorter) + nWorker * sizeof(SortSubtask);

  pSorter = (VdbeSorter*)sqlite3DbMallocZero(db, sz + szKeyInfo);
  pCsr->pSorter = pSorter;
  if( pSorter==0 ){
    rc = SQLITE_NOMEM;
  }else{
    pSorter->pKeyInfo = pKeyInfo = (KeyInfo*)((u8*)pSorter + sz);
    memcpy(pKeyInfo, pCsr->pKeyInfo, szKeyInfo);
    pKeyInfo->db = 0;
    if( nField && nWorker==0 ) pKeyInfo->nField = nField;
    pSorter->pgsz = pgsz = sqlite3BtreeGetPageSize(db->aDb[0].pBt);
    pSorter->nTask = nWorker + 1;
    pSorter->bUseThreads = (pSorter->nTask>1);
    pSorter->db = db;
    for(i=0; i<pSorter->nTask; i++){
      SortSubtask *pTask = &pSorter->aTask[i];
      pTask->pSorter = pSorter;
    }

    if( !sqlite3TempInMemory(db) ){
      u32 szPma = sqlite3GlobalConfig.szPma;
      pSorter->mnPmaSize = szPma * pgsz;
      mxCache = db->aDb[0].pSchema->cache_size;
      if( mxCache<(int)szPma ) mxCache = (int)szPma;
      pSorter->mxPmaSize = MIN((i64)mxCache*pgsz, SQLITE_MAX_PMASZ);

      /* EVIDENCE-OF: R-26747-61719 When the application provides any amount of
      ** scratch memory using SQLITE_CONFIG_SCRATCH, SQLite avoids unnecessary
      ** large heap allocations.
      */
      if( sqlite3GlobalConfig.pScratch==0 ){
        assert( pSorter->iMemory==0 );
        pSorter->nMemory = pgsz;
        pSorter->list.aMemory = (u8*)sqlite3Malloc(pgsz);
        if( !pSorter->list.aMemory ) rc = SQLITE_NOMEM;
      }
    }
  }

  return rc;
}